

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicFunc.cpp
# Opt level: O1

double __thiscall commandClass::log(commandClass *this,double __x)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  double dVar6;
  char authority_;
  char status_;
  int n;
  double expend_;
  double income_;
  string userID_;
  string content_;
  longlong time_;
  fstream file;
  char local_2ae;
  char local_2ad;
  int local_2ac;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  string local_288;
  string local_268;
  undefined1 local_248 [8];
  fstream local_240 [528];
  
  std::fstream::fstream(local_240);
  std::fstream::open((char *)local_240,0x1100e5);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  std::istream::seekg(local_240,0x18,0);
  std::istream::read((char *)local_240,(long)&local_2ac);
  puts("Reporting Employee-------------------------------------");
  if (0 < local_2ac) {
    local_2a0 = 0.0;
    iVar5 = 0;
    local_2a8 = 0.0;
    iVar4 = 0;
    do {
      read_string(local_240,&local_268,0xfa);
      read_string(local_240,&local_288,0x1f);
      std::istream::read((char *)local_240,(long)&local_2ad);
      std::istream::read((char *)local_240,(long)&local_2ae);
      std::istream::read((char *)local_240,(long)local_248);
      std::istream::read((char *)local_240,(long)&local_290);
      std::istream::read((char *)local_240,(long)&local_298);
      if ('0' < local_2ae) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"COMMAND #",9);
        iVar4 = iVar4 + 1;
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_288._M_dataplus._M_p,
                            local_288._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," required to ",0xd);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar1,local_268._M_dataplus._M_p,local_268._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," at time: ",10);
        poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"This line of command was ",0x19);
        pcVar3 = "approved and successfully operated!";
        if (local_2ad == '0') {
          pcVar3 = "rejected and ignored...";
        }
        lVar2 = 0x23;
        if (local_2ad == '0') {
          lVar2 = 0x17;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
        if (local_2a8 < local_290) {
          printf("After this operation, the BookStore earned %.2lf !\n",local_290 - local_2a8);
        }
        if (local_2a0 < local_298) {
          printf("This operation cost the BookStore %.2lf ...\n",local_298 - local_2a0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
        std::ostream::put('H');
        std::ostream::flush();
      }
      local_2a8 = local_290;
      local_2a0 = local_298;
      iVar5 = iVar5 + 1;
    } while (iVar5 < local_2ac);
  }
  puts("Employee Report ends-----------------------------------");
  std::fstream::close();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  dVar6 = (double)std::fstream::~fstream(local_240);
  return dVar6;
}

Assistant:

void commandClass::log() const {
	fstream file;
	file.open("Data_Basic.dat", ios::in | ios::out | ios::binary);
	string content_, userID_; char status_, authority_; long long time_; int n;
	double income_last = 0, expend_last = 0, income_, expend_;
	file.seekg(24);
	file.read(reinterpret_cast<char *> (&n), 4);
	puts("Reporting Employee-------------------------------------");
	for (int i = 1, Case = 0; i <= n; ++i){
		read_string(file, content_, 250);
		read_string(file, userID_, 31);
		file.read(&status_, 1);
		file.read(&authority_, 1);
		file.read(reinterpret_cast<char *> (&time_), 8);
		file.read(reinterpret_cast<char *> (&income_), 8);
		file.read(reinterpret_cast<char *> (&expend_), 8);
		if (authority_ >= '1') {
			cout << "COMMAND #" << ++Case << ":" << endl;
			cout << userID_ << " required to " << content_ << " at time: " << time_ << endl;
			cout << "This line of command was "
				 << (status_ == '0' ? "rejected and ignored..." : "approved and successfully operated!") << endl;
			if (income_ > income_last) {
				printf("After this operation, the BookStore earned %.2lf !\n", income_ - income_last);
			}
			if (expend_ > expend_last) {
				printf("This operation cost the BookStore %.2lf ...\n", expend_ - expend_last);
			}
			cout << endl;
		}
		income_last = income_, expend_last = expend_;
	}
	puts("Employee Report ends-----------------------------------");
	file.close();
}